

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<(anonymous_namespace)::SwizzleToRGBATestR8_RRRONE_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::SwizzleToRGBATestR8_RRRONE_Test> *this)

{
  Test *this_00;
  initializer_list<unsigned_char> __l;
  allocator_type local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> color;
  uchar local_34 [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> defaultColor;
  
  this_00 = (Test *)operator_new(0x158);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__SwizzleTestBase_00185288;
  WriterTestHelper<unsigned_char,_1U,_33321U>::WriterTestHelper
            ((WriterTestHelper<unsigned_char,_1U,_33321U> *)(this_00 + 1));
  this_00[0x15]._vptr_Test = (_func_int **)0x1000000010;
  color.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  color.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  color.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  builtin_memcpy(local_34,"\x01\x02\x03\x04",4);
  __l._M_len = 4;
  __l._M_array = local_34;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&defaultColor,__l,&local_59);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&color,1);
  *color.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start =
       *defaultColor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  WriterTestHelper<unsigned_char,_1U,_33321U>::resize
            ((WriterTestHelper<unsigned_char,_1U,_33321U> *)(this_00 + 1),0,1,1,2,
             *(ktx_uint32_t *)&this_00[0x15]._vptr_Test,
             *(ktx_uint32_t *)((long)&this_00[0x15]._vptr_Test + 4),1,&color);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&defaultColor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&color.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  this_00->_vptr_Test = (_func_int **)&PTR__SwizzleTestBase_00185200;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }